

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::extractCliques
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,vector<int,_std::allocator<int>_> *inds,
          vector<double,_std::allocator<double>_> *vals,
          vector<signed_char,_std::allocator<signed_char>_> *complementation,double rhs,
          HighsInt nbin,vector<int,_std::allocator<int>_> *perm,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique,
          double feastol)

{
  HighsMipSolverData *pHVar1;
  int *piVar2;
  pointer piVar3;
  pointer pcVar4;
  double *pdVar5;
  pointer pCVar6;
  pointer pdVar7;
  CliqueVar *cliquevars;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  anon_class_8_1_8992ca70 aVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  HighsInt j;
  long lVar18;
  int *piVar19;
  long lVar20;
  uint uVar21;
  int *piVar22;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  int iVar25;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar26;
  ulong in_XMM1_Qb;
  double dVar27;
  double dVar28;
  double dVar29;
  int iVar30;
  int iVar33;
  undefined1 auVar32 [16];
  double dVar34;
  HighsCDouble local_100;
  ulong local_f0;
  anon_class_8_1_8992ca70 local_e8;
  int local_dc;
  double local_d8;
  vector<signed_char,_std::allocator<signed_char>_> *local_d0;
  double local_c8;
  ulong uStack_c0;
  ulong local_b0;
  HighsMipSolver *local_a8;
  HighsCliqueTable *local_a0;
  HighsImplications *local_98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  ulong local_88;
  long local_80;
  double local_78;
  double local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  undefined1 auVar31 [16];
  
  pHVar1 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_e8.vals = vals;
  local_d8 = rhs;
  local_d0 = complementation;
  local_c8 = feastol;
  uStack_c0 = in_XMM1_Qb;
  local_a8 = mipsolver;
  local_a0 = this;
  std::vector<int,_std::allocator<int>_>::resize
            (perm,(long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2);
  auVar11 = _DAT_003bf640;
  auVar10 = _DAT_003beea0;
  auVar9 = _DAT_003bee90;
  piVar22 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_90._M_current = piVar22;
  if (piVar22 != piVar2) {
    uVar15 = (long)piVar2 + (-4 - (long)piVar22);
    auVar32._8_4_ = (int)uVar15;
    auVar32._0_8_ = uVar15;
    auVar32._12_4_ = (int)(uVar15 >> 0x20);
    auVar24._0_8_ = uVar15 >> 2;
    auVar24._8_8_ = auVar32._8_8_ >> 2;
    uVar17 = 0;
    auVar24 = auVar24 ^ _DAT_003beea0;
    do {
      iVar30 = (int)uVar17;
      auVar31._8_4_ = iVar30;
      auVar31._0_8_ = uVar17;
      auVar31._12_4_ = (int)(uVar17 >> 0x20);
      auVar32 = (auVar31 | auVar9) ^ auVar10;
      iVar14 = auVar24._0_4_;
      bVar8 = iVar14 < auVar32._0_4_;
      iVar25 = auVar24._4_4_;
      iVar33 = auVar32._4_4_;
      if ((bool)(~(iVar25 < iVar33 || iVar33 == iVar25 && bVar8) & 1)) {
        piVar22[uVar17] = iVar30;
      }
      if (iVar25 >= iVar33 && (iVar33 != iVar25 || !bVar8)) {
        piVar22[uVar17 + 1] = iVar30 + 1;
      }
      auVar32 = (auVar31 | auVar11) ^ auVar10;
      iVar33 = auVar32._4_4_;
      if (iVar33 <= iVar25 && (iVar33 != iVar25 || auVar32._0_4_ <= iVar14)) {
        piVar22[uVar17 + 2] = iVar30 + 2;
        piVar22[uVar17 + 3] = iVar30 + 3;
      }
      uVar17 = uVar17 + 4;
    } while (((uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar17);
    piVar3 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    lVar18 = *(long *)&(((pHVar1->domain).mipsolver)->model_->integrality_).
                       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl;
    piVar13 = piVar22;
    piVar19 = piVar2;
    do {
      while( true ) {
        local_90._M_current = piVar13;
        iVar14 = *local_90._M_current;
        lVar20 = (long)piVar3[iVar14];
        if ((((*(char *)(lVar18 + lVar20) == '\0') ||
             (dVar23 = *(double *)
                        (*(long *)&(pHVar1->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar20 * 8), dVar23 != 0.0)) || (NAN(dVar23))) ||
           ((dVar23 = *(double *)
                       (*(long *)&(pHVar1->domain).col_upper_.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       lVar20 * 8), dVar23 != 1.0 || (NAN(dVar23))))) break;
        local_90._M_current = local_90._M_current + 1;
        piVar13 = local_90._M_current;
        if (local_90._M_current == piVar19) goto LAB_0025e894;
      }
      do {
        piVar19 = piVar19 + -1;
        if (local_90._M_current == piVar19) goto LAB_0025e894;
        lVar20 = (long)piVar3[*piVar19];
      } while (((*(char *)(lVar18 + lVar20) == '\0') ||
               (dVar23 = *(double *)
                          (*(long *)&(pHVar1->domain).col_lower_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          lVar20 * 8), dVar23 != 0.0)) ||
              ((NAN(dVar23) ||
               ((dVar23 = *(double *)
                           (*(long *)&(pHVar1->domain).col_upper_.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                           lVar20 * 8), dVar23 != 1.0 || (NAN(dVar23)))))));
      *local_90._M_current = *piVar19;
      *piVar19 = iVar14;
      piVar13 = local_90._M_current + 1;
    } while (piVar19 != local_90._M_current + 1);
    local_90._M_current = local_90._M_current + 1;
  }
LAB_0025e894:
  local_f0 = (ulong)((long)local_90._M_current - (long)piVar22) >> 2;
  local_b0 = (ulong)((long)piVar2 - (long)piVar22) >> 2;
  iVar14 = (int)local_f0;
  if (iVar14 != 0 && iVar14 < (int)local_b0) {
    local_98 = &pHVar1->implications;
    local_68 = -local_c8;
    uStack_60 = uStack_c0 ^ 0x8000000000000000;
    local_80 = (long)iVar14;
    local_88 = local_f0 & 0xffffffff;
    local_b0 = (ulong)(uint)((int)local_b0 - iVar14);
    uVar15 = 0;
    do {
      iVar14 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start[uVar15];
      local_dc = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar14];
      dVar23 = ((local_e8.vals)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[iVar14];
      local_78 = local_d8 - dVar23;
      local_58 = (-dVar23 - (local_78 - local_d8)) + (local_d8 - (local_78 - (local_78 - local_d8)))
                 + 0.0;
      uStack_50 = 0x8000000000000000;
      uVar17 = local_b0 & 0xffffffff;
      lVar18 = local_80;
      do {
        iVar14 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar18];
        iVar25 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar14];
        lVar20 = (long)iVar25;
        dVar23 = *(double *)
                  (*(long *)&(pHVar1->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar20 * 8);
        dVar26 = *(double *)
                  (*(long *)&(pHVar1->domain).col_upper_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  lVar20 * 8);
        if ((dVar23 != dVar26) || (NAN(dVar23) || NAN(dVar26))) {
          uStack_40 = 0;
          local_100.hi = local_78;
          local_100.lo = local_58;
          local_70 = dVar26;
          local_48 = dVar23;
          HighsCDouble::operator/=
                    (&local_100,
                     ((local_e8.vals)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar14]);
          dVar23 = local_100.hi;
          dVar26 = local_100.lo;
          if ((local_a8->model_->integrality_).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20] != kContinuous) {
            dVar23 = floor(local_100.hi + local_100.lo +
                           ((local_a8->mipdata_)._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                           feastol);
            dVar26 = 0.0;
          }
          dVar29 = local_70 - local_48;
          dVar34 = (-local_48 - (dVar29 - local_70)) + (local_70 - (dVar29 - (dVar29 - local_70))) +
                   0.0;
          dVar27 = dVar29 - local_c8;
          if (dVar23 + dVar26 <
              (local_68 - (dVar27 - dVar29)) + (dVar29 - (dVar27 - (dVar27 - dVar29))) + dVar34 +
              dVar27) {
            piVar3 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar4 = (local_d0->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if (pcVar4[piVar3[uVar15]] == -1) {
              dVar28 = dVar29 - dVar23;
              dVar27 = (dVar34 + (-dVar23 - (dVar28 - dVar29)) +
                                 (dVar29 - (dVar28 - (dVar28 - dVar29)))) - dVar26;
            }
            else {
              dVar28 = dVar23 - dVar29;
              dVar27 = (dVar26 + (-dVar29 - (dVar28 - dVar23)) +
                                 (dVar23 - (dVar28 - (dVar28 - dVar23)))) - dVar34;
              dVar23 = dVar29;
              dVar26 = dVar34;
            }
            if (pcVar4[piVar3[lVar18]] == -1) {
              dVar29 = *(double *)
                        (*(long *)&(pHVar1->domain).col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar20 * 8);
              uVar16 = (ulong)DAT_003be0d0;
              dVar34 = dVar23 - dVar29;
              HighsImplications::addVLB
                        (local_98,iVar25,local_dc,(double)((ulong)(dVar28 + dVar27) ^ uVar16),
                         (double)((ulong)(dVar26 + (dVar23 - (dVar29 + dVar34)) +
                                                   ((double)((ulong)dVar29 ^ uVar16) -
                                                   (dVar34 - (dVar29 + dVar34))) + dVar34) ^ uVar16)
                        );
            }
            else {
              dVar29 = *(double *)
                        (*(long *)&(pHVar1->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        lVar20 * 8);
              dVar34 = dVar23 + dVar29;
              HighsImplications::addVUB
                        (local_98,iVar25,local_dc,dVar28 + dVar27,
                         dVar26 + (dVar23 - (dVar34 - dVar29)) +
                                  (dVar29 - (dVar34 - (dVar34 - dVar29))) + dVar34);
            }
          }
        }
        lVar18 = lVar18 + 1;
        uVar21 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar21;
      } while (uVar21 != 0);
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_88);
  }
  aVar12.vals = local_e8.vals;
  if (1 < (int)local_f0) {
    begin._M_current =
         (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
    if (begin._M_current != local_90._M_current) {
      uVar15 = (long)local_90._M_current - (long)begin._M_current >> 2;
      iVar14 = 0;
      if (1 < uVar15) {
        iVar14 = 0;
        do {
          uVar15 = (long)uVar15 >> 1;
          iVar14 = iVar14 + 1;
        } while (1 < uVar15);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractCliques(HighsMipSolver_const&,std::vector<int,std::allocator<int>>&,std::vector<double,std::allocator<double>>&,std::vector<signed_char,std::allocator<signed_char>>&,double,int,std::vector<int,std::allocator<int>>&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,double)::__1,false>
                (begin,local_90,local_e8,iVar14,true);
      begin._M_current =
           (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
    }
    pdVar5 = ((aVar12.vals)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (local_d8 + local_c8 < pdVar5[*begin._M_current] + pdVar5[begin._M_current[1]]) {
      uVar21 = (uint)local_f0;
      uVar15 = (ulong)(uVar21 - 1);
      dVar23 = pdVar5[begin._M_current[uVar15]];
      if ((local_c8 < ABS(*pdVar5 - dVar23)) || ((dVar23 + dVar23) - local_c8 <= local_d8)) {
        if (uVar15 != 0) {
          do {
            pdVar7 = ((local_e8.vals)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar17 = uVar15;
            piVar22 = begin._M_current;
            do {
              uVar16 = uVar17 >> 1;
              if ((local_d8 - pdVar7[begin._M_current[uVar15]]) + local_c8 < pdVar7[piVar22[uVar16]]
                 ) {
                piVar22 = piVar22 + uVar16 + 1;
                uVar16 = ~uVar16 + uVar17;
              }
              uVar17 = uVar16;
            } while (0 < (long)uVar16);
            if (piVar22 != begin._M_current) {
              pCVar6 = (clique->
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_finish != pCVar6) {
                (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_finish = pCVar6;
                begin._M_current =
                     (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
              }
              if (begin._M_current != piVar22) {
                do {
                  if ((local_d0->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                      _M_impl.super__Vector_impl_data._M_start[*begin._M_current] == -1) {
                    local_100.hi = (double)((ulong)local_100.hi._4_4_ << 0x20);
                  }
                  else {
                    local_100.hi = (double)CONCAT44(local_100.hi._4_4_,1);
                  }
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  emplace_back<int&,int>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)clique,
                             (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + *begin._M_current,(int *)&local_100)
                  ;
                  begin._M_current = begin._M_current + 1;
                } while (begin._M_current != piVar22);
                begin._M_current =
                     (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
              }
              if ((local_d0->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                  super__Vector_impl_data._M_start[begin._M_current[uVar15]] == -1) {
                local_100.hi = (double)((ulong)local_100.hi._4_4_ << 0x20);
              }
              else {
                local_100.hi = (double)CONCAT44(local_100.hi._4_4_,1);
              }
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int&,int>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)clique,
                         (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start + begin._M_current[uVar15],
                         (int *)&local_100);
              cliquevars = (clique->
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           )._M_impl.super__Vector_impl_data._M_start;
              uVar17 = (long)(clique->
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)cliquevars >> 2;
              if (uVar17 < 2) {
                begin._M_current =
                     (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
              }
              else {
                addClique(local_a0,local_a8,cliquevars,(HighsInt)uVar17,false,0x7fffffff);
                if ((pHVar1->domain).infeasible_ != false) {
                  return;
                }
                begin._M_current =
                     (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
              }
              if (piVar22 == begin._M_current + uVar15) {
                return;
              }
            }
            uVar15 = uVar15 - 1;
          } while ((int)uVar15 != 0);
        }
      }
      else {
        pCVar6 = (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_finish != pCVar6) {
          (clique->
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          )._M_impl.super__Vector_impl_data._M_finish = pCVar6;
        }
        uVar15 = 0;
        do {
          iVar14 = (perm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar15];
          if ((local_d0->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar14] == -1) {
            local_100.hi = (double)((ulong)local_100.hi._4_4_ << 0x20);
          }
          else {
            local_100.hi = (double)CONCAT44(local_100.hi._4_4_,1);
          }
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          emplace_back<int&,int>
                    ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                      *)clique,
                     (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start + iVar14,(int *)&local_100);
          uVar15 = uVar15 + 1;
        } while ((uVar21 & 0x7fffffff) != uVar15);
        addClique(local_a0,local_a8,
                  (clique->
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  )._M_impl.super__Vector_impl_data._M_start,(HighsInt)local_f0,false,0x7fffffff);
      }
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::extractCliques(
    const HighsMipSolver& mipsolver, std::vector<HighsInt>& inds,
    std::vector<double>& vals, std::vector<int8_t>& complementation, double rhs,
    HighsInt nbin, std::vector<HighsInt>& perm, std::vector<CliqueVar>& clique,
    double feastol) {
  HighsImplications& implics = mipsolver.mipdata_->implications;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  perm.resize(inds.size());
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return globaldom.isBinary(inds[pos]);
  });
  nbin = binaryend - perm.begin();
  HighsInt ntotal = (HighsInt)perm.size();

  // if not all variables are binary, we extract variable upper and lower bounds
  // constraints on the non-binary variable for each binary variable in the
  // constraint
  if (nbin < ntotal) {
    for (HighsInt i = 0; i != nbin; ++i) {
      HighsInt bincol = inds[perm[i]];
      HighsCDouble impliedub = HighsCDouble(rhs) - vals[perm[i]];
      for (HighsInt j = nbin; j != ntotal; ++j) {
        HighsInt col = inds[perm[j]];
        if (globaldom.isFixed(col)) continue;

        HighsCDouble colub =
            HighsCDouble(globaldom.col_upper_[col]) - globaldom.col_lower_[col];
        HighsCDouble implcolub = impliedub / vals[perm[j]];
        if (mipsolver.variableType(col) != HighsVarType::kContinuous)
          implcolub =
              std::floor(double(implcolub) + mipsolver.mipdata_->feastol);

        if (implcolub < colub - feastol) {
          HighsCDouble coef;
          HighsCDouble constant;

          if (complementation[perm[i]] == -1) {
            coef = colub - implcolub;
            constant = implcolub;
          } else {
            coef = implcolub - colub;
            constant = colub;
          }

          if (complementation[perm[j]] == -1) {
            constant -= globaldom.col_upper_[col];
            implics.addVLB(col, bincol, -double(coef), -double(constant));
          } else {
            constant += globaldom.col_lower_[col];
            implics.addVUB(col, bincol, double(coef), double(constant));
          }
        }
      }
    }
  }

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(vals[p1], p1) > std::make_pair(vals[p2], p2);
  });
  // check if any cliques exists
  if (vals[perm[0]] + vals[perm[1]] <= rhs + feastol) return;

  // check if this is a set packing constraint (or easily transformable
  // into one)
  if (std::abs(vals[0] - vals[perm[nbin - 1]]) <= feastol &&
      rhs < 2 * vals[perm[nbin - 1]] - feastol) {
    // the coefficients on the binary variables are all equal and the
    // right hand side is strictly below two times the coefficient value.
    // Therefore the constraint can be transformed into a set packing
    // constraint by relaxing out all non-binary variables (if any),
    // dividing by the coefficient value of the binary variables, and then
    // possibly rounding down the right hand side
    clique.clear();

    for (auto j = 0; j != nbin; ++j) {
      HighsInt pos = perm[j];
      if (complementation[pos] == -1)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    addClique(mipsolver, clique.data(), nbin);
    if (globaldom.infeasible()) return;
    // printf("extracted this clique:\n");
    // printClique(clique);
    return;
  }

  for (HighsInt k = nbin - 1; k != 0; --k) {
    double mincliqueval = rhs - vals[perm[k]] + feastol;
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return vals[p] > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (complementation[pos] == -1)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (complementation[perm[k]] == -1)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique:\n");
    // printClique(clique);

    if (clique.size() >= 2) {
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);
      // runCliqueMerging(globaldom, clique);
      // if (clique.size() >= 2) {
      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible()) return;
      //}
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}